

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPServer::getp_get_port
          (CVmObjHTTPServer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_val_t *in_RDX;
  CVmNativeCodeDesc *in_RDI;
  int port;
  char *ip;
  char *addr;
  undefined4 in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  vm_val_t *in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  CVmObjHTTPServer *in_stack_ffffffffffffffc8;
  
  if ((getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_port::desc,0);
    __cxa_guard_release(&getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  if (iVar1 == 0) {
    iVar1 = get_listener_addr(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              (char **)in_stack_ffffffffffffffb8,
                              (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar1 == 0) {
      vm_val_t::set_nil(in_RDX);
    }
    else {
      vm_val_t::set_int(in_RDX,in_stack_ffffffffffffffb4);
      lib_free_str((char *)0x25c78c);
      lib_free_str((char *)0x25c796);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPServer::getp_get_port(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* return the port number */
    char *addr, *ip;
    int port;
    if (get_listener_addr(addr, ip, port))
    {
        retval->set_int(port);
        lib_free_str(addr);
        lib_free_str(ip);
    }
    else
        retval->set_nil();

    /* handled */
    return TRUE;
}